

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O2

string * __thiscall
ApprovalTests::ApprovalTestNamer::getTestName_abi_cxx11_
          (string *__return_storage_ptr__,ApprovalTestNamer *this)

{
  TestName *pTVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  TestName test;
  stringstream ext;
  string sStack_228;
  TestName local_208;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  pTVar1 = getCurrentTest();
  TestName::TestName(&local_208,pTVar1);
  lVar2 = 0;
  for (uVar3 = 0;
      uVar3 < (ulong)((long)local_208.sections.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_208.sections.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar3 = uVar3 + 1) {
    if (uVar3 != 0) {
      ::std::operator<<(local_1a0,".");
    }
    ::std::operator<<(local_1a0,
                      (string *)
                      ((long)&((local_208.sections.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar2));
    lVar2 = lVar2 + 0x20;
  }
  ::std::__cxx11::stringbuf::str();
  convertToFileName(__return_storage_ptr__,&sStack_228);
  ::std::__cxx11::string::~string((string *)&sStack_228);
  TestName::~TestName(&local_208);
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string ApprovalTestNamer::getTestName() const
    {
        std::stringstream ext;
        auto test = getCurrentTest();
        for (size_t i = 0; i < test.sections.size(); i++)
        {
            if (0 < i)
            {
                ext << ".";
            }
            ext << test.sections[i];
        }

        return convertToFileName(ext.str());
    }